

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ClearTex2DCase::iterate(ClearTex2DCase *this)

{
  RenderContext *context;
  anon_unknown_1 *this_00;
  uint width;
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  ConstPixelBufferAccess *result_00;
  char *description;
  int x;
  uint a;
  uint height;
  uint a_00;
  uint uVar5;
  uint stencil;
  Texture depthStencilTex;
  Renderbuffer colorBuf;
  ConstPixelBufferAccess local_e8;
  Framebuffer fbo;
  TextureLevel reference;
  TextureLevel result;
  ConstPixelBufferAccess local_58;
  Functions *gl;
  
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar2 = (*context->_vptr_RenderContext[3])(context);
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper(&fbo,context);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper(&colorBuf,context);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper(&depthStencilTex,context);
  reference.m_format.order = RGBA;
  reference.m_format.type = UNSIGNED_INT32;
  tcu::TextureLevel::TextureLevel(&result,&reference.m_format,0x7d,0x75,1);
  local_e8.m_format.order = S;
  local_e8.m_format.type = UNSIGNED_INT8;
  tcu::TextureLevel::TextureLevel(&reference,&local_e8.m_format,0x7d,0x75,1);
  checkDepthStencilFormatSupport((this->super_TestCase).m_context,this->m_format);
  (*gl->bindRenderbuffer)(0x8d41,colorBuf.super_ObjectWrapper.m_object);
  (*gl->renderbufferStorage)(0x8d41,0x8236,0x7d,0x75);
  (*gl->bindTexture)(0xde1,depthStencilTex.super_ObjectWrapper.m_object);
  (*gl->texStorage2D)(0xde1,1,this->m_format,0x7d,0x75);
  (*gl->bindFramebuffer)(0x8d40,fbo.super_ObjectWrapper.m_object);
  (*gl->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,colorBuf.super_ObjectWrapper.m_object);
  (*gl->framebufferTexture2D)(0x8d40,0x821a,0xde1,depthStencilTex.super_ObjectWrapper.m_object,0);
  checkFramebufferStatus(gl);
  (*gl->enable)(0xc11);
  for (a_00 = 0; a_00 < 0x75; a_00 = a_00 + 8) {
    height = 0x75 - a_00;
    if (7 < height) {
      height = 8;
    }
    dVar3 = deInt32Hash(a_00);
    uVar5 = 0x7d;
    for (a = 0; a < 0x7d; a = a + 8) {
      width = 8;
      if (uVar5 < 8) {
        width = uVar5;
      }
      dVar4 = deInt32Hash(a);
      stencil = (dVar4 ^ dVar3) & 0xff;
      (*gl->clearStencil)(stencil);
      (*gl->scissor)(a,a_00,width,height);
      (*gl->clear)(0x400);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_58,&reference);
      tcu::getSubregion((PixelBufferAccess *)&local_e8,(PixelBufferAccess *)&local_58,a,a_00,width,
                        height);
      tcu::clearStencil((PixelBufferAccess *)&local_e8,stencil);
      uVar5 = uVar5 - 8;
    }
  }
  (*gl->disable)(0xc11);
  (*gl->framebufferRenderbuffer)(0x8d40,0x821a,0x8d41,0);
  checkFramebufferStatus(gl);
  blitStencilToColor2D(context,depthStencilTex.super_ObjectWrapper.m_object,0x7d,0x75);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_e8,&result);
  result_00 = &local_e8;
  glu::readPixels(context,0,0,(PixelBufferAccess *)result_00);
  this_00 = (anon_unknown_1 *)
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_e8,&reference);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_58,&result);
  bVar1 = compareStencilToRed(this_00,(TestLog *)&local_e8,&local_58,result_00);
  description = "Image comparison failed";
  if (bVar1) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar1,description
            );
  tcu::TextureLevel::~TextureLevel(&reference);
  tcu::TextureLevel::~TextureLevel(&result);
  glu::ObjectWrapper::~ObjectWrapper(&depthStencilTex.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&colorBuf.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&fbo.super_ObjectWrapper);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&	renderCtx		= m_context.getRenderContext();
		const glw::Functions&		gl				= renderCtx.getFunctions();
		const int					width			= 125;
		const int					height			= 117;
		const int					cellSize		= 8;
		glu::Framebuffer			fbo				(renderCtx);
		glu::Renderbuffer			colorBuf		(renderCtx);
		glu::Texture				depthStencilTex	(renderCtx);
		TextureLevel				result			(TextureFormat(TextureFormat::RGBA, TextureFormat::UNSIGNED_INT32), width, height);
		TextureLevel				reference		(TextureFormat(TextureFormat::S, TextureFormat::UNSIGNED_INT8), width, height);

		checkDepthStencilFormatSupport(m_context, m_format);

		gl.bindRenderbuffer(GL_RENDERBUFFER, *colorBuf);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_R32UI, width, height);

		gl.bindTexture(GL_TEXTURE_2D, *depthStencilTex);
		gl.texStorage2D(GL_TEXTURE_2D, 1, m_format, width, height);

		gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *colorBuf);
		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, GL_TEXTURE_2D, *depthStencilTex, 0);
		checkFramebufferStatus(gl);

		gl.enable(GL_SCISSOR_TEST);

		for (int y = 0; y < height; y += cellSize)
		{
			for (int x = 0; x < width; x += cellSize)
			{
				const int		clearW		= de::min(cellSize, width-x);
				const int		clearH		= de::min(cellSize, height-y);
				const int		stencil		= int((deInt32Hash(x) ^ deInt32Hash(y)) & 0xff);

				gl.clearStencil(stencil);
				gl.scissor(x, y, clearW, clearH);
				gl.clear(GL_STENCIL_BUFFER_BIT);

				tcu::clearStencil(tcu::getSubregion(reference.getAccess(), x, y, clearW, clearH), stencil);
			}
		}

		gl.disable(GL_SCISSOR_TEST);

		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, GL_RENDERBUFFER, 0);
		checkFramebufferStatus(gl);

		blitStencilToColor2D(renderCtx, *depthStencilTex, width, height);
		glu::readPixels(renderCtx, 0, 0, result.getAccess());

		{
			const bool compareOk = compareStencilToRed(m_testCtx.getLog(), reference, result);
			m_testCtx.setTestResult(compareOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL,
									compareOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}